

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

int __thiscall lf::geometry::Parallelogram::init(Parallelogram *this,EVP_PKEY_CTX *ctx)

{
  Index IVar1;
  Matrix<double,__1,_4,_0,__1,_4> *this_00;
  Matrix<double,__1,_2,_0,__1,_2> *pMVar2;
  double extraout_XMM0_Qa;
  Scalar __x;
  double dVar3;
  non_const_type local_290;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
  local_288;
  non_const_type local_278;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
  local_270;
  XprTypeNested local_260;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_0>
  local_250;
  Matrix<double,__1,__1,_0,__1,__1> local_238;
  non_const_type local_220;
  XprTypeNested local_218;
  ColXpr local_210;
  ColXpr local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_190;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> local_118 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>> local_e0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_a8;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_30;
  Parallelogram *local_10;
  Parallelogram *this_local;
  
  this_00 = &this->coords_;
  local_10 = this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ColXpr *)local_e0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)this_00,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            ((ColXpr *)local_118,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)this_00,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>>::operator-
            (&local_a8,local_e0,local_118);
  Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
            (&local_30,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->jacobian_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
              *)&local_a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_1c8,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)this_00,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_210,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>>::operator-
            (&local_190,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>> *)&local_1c8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *)
             &local_210);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
              *)&local_190);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_30);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::rows
                    (&(this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>
                    );
  if (IVar1 == 2) {
    local_220 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_218.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                    &local_220);
    Eigen::Matrix<double,-1,2,0,-1,2>::operator=
              ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,
               (DenseBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>_>
                *)&local_218);
    pMVar2 = &this->jacobian_;
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::determinant
              ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)pMVar2);
    std::abs((int)pMVar2);
    this->integrationElement_ = extraout_XMM0_Qa;
  }
  else {
    pMVar2 = &this->jacobian_;
    local_278 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)pMVar2);
    local_270 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>> *)
                           &local_278,(MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)pMVar2)
    ;
    local_260 = (XprTypeNested)
                Eigen::
                MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>
                ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>
                           *)&local_270);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
              (&local_250,(MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)pMVar2,
               (MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>_>
                *)&local_260);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>,Eigen::Matrix<double,_1,2,0,_1,2>,0>>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_238,&local_250);
    Eigen::Matrix<double,-1,2,0,-1,2>::operator=
              ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_238);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_238);
    local_290 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_288 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>> *)
                           &local_290,
                           (MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    __x = Eigen::
          MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>
          ::determinant((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>
                         *)&local_288);
    dVar3 = sqrt(__x);
    this->integrationElement_ = dVar3;
  }
  return (int)this;
}

Assistant:

void Parallelogram::init() {
  jacobian_ << coords_.col(1) - coords_.col(0), coords_.col(3) - coords_.col(0);
  // Distinguish between different world dimensions
  if (coords_.rows() == 2) {
    // 2D case: Simpler formula!
    jacobian_inverse_gramian_ = jacobian_.transpose().inverse();
    integrationElement_ = std::abs(jacobian_.determinant());
  } else {
    // 3D case: complicated formula
    jacobian_inverse_gramian_ = Eigen::MatrixXd(
        jacobian_ * (jacobian_.transpose() * jacobian_).inverse());
    integrationElement_ =
        std::sqrt((jacobian_.transpose() * jacobian_).determinant());
  }
}